

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Variable * __thiscall
soul::PoolAllocator::
allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
          (PoolAllocator *this,CodeLocation *args,Type *args_1,Identifier *args_2,Role *args_3)

{
  UTF8Reader *this_00;
  SourceCodeText *pSVar1;
  _lambda_void___1_ local_81;
  string *local_80;
  Type local_68;
  CodeLocation local_50;
  Variable *local_40;
  Variable *newObject;
  PoolItem *newItem;
  Role *args_local_3;
  Identifier *args_local_2;
  Type *args_local_1;
  CodeLocation *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_3;
  args_local_3 = (Role *)args_2;
  args_local_2 = (Identifier *)args_1;
  args_local_1 = (Type *)args;
  args_local = (CodeLocation *)this;
  newObject = (Variable *)allocateSpaceForObject(this,0x88);
  this_00 = &(newObject->super_Expression).super_Object.location.location;
  CodeLocation::CodeLocation(&local_50,(CodeLocation *)args_local_1);
  Type::Type(&local_68,(Type *)args_local_2);
  local_80 = *(string **)args_local_3;
  heart::Variable::Variable
            ((Variable *)this_00,&local_50,&local_68,(Identifier)local_80,(Role)newItem->size);
  Type::~Type(&local_68);
  CodeLocation::~CodeLocation(&local_50);
  local_40 = (Variable *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::CodeLocation&&,soul::Type&,soul::Identifier&,soul::heart::Variable::Role&&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_81);
  (newObject->super_Expression).super_Object.location.sourceCode.object = pSVar1;
  return local_40;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }